

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfok.c
# Opt level: O0

err_t pfokDH(octet *sharekey,pfok_params *params,octet *privkey,octet *pubkey)

{
  bool_t bVar1;
  int iVar2;
  word *stack_00;
  word *a;
  word *b;
  ulong count;
  size_t sVar3;
  size_t sVar4;
  octet *mod;
  qr_o *a_00;
  size_t *a_01;
  size_t *psVar5;
  qr_o *r;
  word wVar6;
  void *in_RCX;
  void *in_RDX;
  long *in_RSI;
  void *in_RDI;
  void *stack;
  qr_o *qr;
  word *y;
  word *x;
  void *state;
  size_t mo;
  size_t m;
  size_t no;
  size_t n;
  void *in_stack_ffffffffffffff58;
  size_t in_stack_ffffffffffffff60;
  size_t *dest;
  pfok_params *in_stack_ffffffffffffff68;
  word *l;
  size_t in_stack_ffffffffffffff80;
  qr_o *r_00;
  word *c;
  err_t local_4;
  
  bVar1 = memIsValid(in_RSI,0x2f8);
  if (bVar1 == 0) {
    local_4 = 0x6d;
  }
  else {
    bVar1 = pfokParamsIsOperable(in_stack_ffffffffffffff68);
    if (bVar1 == 0) {
      local_4 = 0x1f6;
    }
    else {
      stack_00 = (word *)(*in_RSI + 0x3fU >> 6);
      a = (word *)(*in_RSI + 7U >> 3);
      b = (word *)(in_RSI[1] + 0x3fU >> 6);
      count = in_RSI[1] + 7U >> 3;
      bVar1 = memIsValid(in_RDX,count);
      if (((bVar1 != 0) && (bVar1 = memIsValid(in_RCX,(size_t)a), bVar1 != 0)) &&
         (bVar1 = memIsValid(in_RDI,in_RSI[2] + 7U >> 3), bVar1 != 0)) {
        sVar3 = (long)stack_00 * 8 + (long)b * 8;
        sVar4 = zmMontCreate_keep((size_t)a);
        mod = (octet *)(sVar3 + sVar4);
        sVar4 = zmMontCreate_deep(in_stack_ffffffffffffff80);
        l = stack_00;
        c = stack_00;
        zmMontCreate_deep(sVar4);
        sVar3 = qrPower_deep((size_t)stack_00,sVar3,in_stack_ffffffffffffff60);
        utilMax(2,sVar4,sVar3);
        a_00 = (qr_o *)blobCreate((size_t)in_stack_ffffffffffffff58);
        if (a_00 == (qr_o *)0x0) {
          return 0x6e;
        }
        a_01 = &(a_00->hdr).keep + (long)b;
        psVar5 = a_01 + (long)c;
        dest = psVar5;
        r_00 = a_00;
        sVar3 = zmMontCreate_keep((size_t)a);
        r = (qr_o *)((long)dest + sVar3);
        zmMontCreate(r,mod,sVar4,(size_t)l,stack_00);
        u64From(dest,in_stack_ffffffffffffff58,0x16c0ff);
        wVar6 = wwGetBits((word *)a_00,in_RSI[1],(long)b * 0x40 - in_RSI[1]);
        if (wVar6 != 0) {
          blobClose((blob_t)0x16c13a);
          return 0x1f8;
        }
        u64From(dest,in_stack_ffffffffffffff58,0x16c161);
        bVar1 = wwIsZero(a_01,(size_t)c);
        if ((bVar1 == 0) && (iVar2 = wwCmp(a_01,(word *)psVar5[3],(size_t)c), iVar2 < 0)) {
          qrPower(c,a,b,count,r_00,a_00);
          (*(code *)psVar5[9])(a_01,a_01,psVar5,r);
          memCopy(dest,in_stack_ffffffffffffff58,0x16c214);
          if ((in_RSI[2] & 7U) != 0) {
            *(byte *)((long)in_RDI + ((ulong)in_RSI[2] >> 3)) =
                 *(byte *)((long)in_RDI + ((ulong)in_RSI[2] >> 3)) &
                 (byte)(0xff >> (8 - ((byte)in_RSI[2] & 7) & 0x1f));
          }
          blobClose((blob_t)0x16c276);
          return 0;
        }
        blobClose((blob_t)0x16c19c);
        return 0x1f9;
      }
      local_4 = 0x6d;
    }
  }
  return local_4;
}

Assistant:

err_t pfokDH(octet sharekey[], const pfok_params* params, 
	const octet privkey[], const octet pubkey[])
{
	size_t n, no;
	size_t m, mo;
	// состояние
	void* state;
	word* x;				/* [m] личный ключ */
	word* y;				/* [n] открытый ключ визави */
	qr_o* qr;				/* описание кольца Монтгомери */
	void* stack;
	// проверить params
	if (!memIsValid(params, sizeof(pfok_params)))
		return ERR_BAD_INPUT;
	// работоспособные параметры?
	if (!pfokParamsIsOperable(params))
		return ERR_BAD_PARAMS;
	// размерности
	n = W_OF_B(params->l), no = O_OF_B(params->l);
	m = W_OF_B(params->r), mo = O_OF_B(params->r);
	// проверить остальные входные данные
	if (!memIsValid(privkey, mo) || 
		!memIsValid(pubkey, no) ||
		!memIsValid(sharekey, O_OF_B(params->n)))
		return ERR_BAD_INPUT;
	// создать состояние
	state = blobCreate(
		O_OF_W(n) + O_OF_W(m) + zmMontCreate_keep(no) +  
		utilMax(2,
			zmMontCreate_deep(no),
			qrPower_deep(n, n, zmMontCreate_deep(no))));
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// раскладка состояния
	x = (word*)state;
	y = x + m;
	qr = (qr_o*)(y + n);
	stack = (octet*)qr + zmMontCreate_keep(no);
	// построить кольцо Монтгомери
	zmMontCreate(qr, params->p, no, params->l + 2, stack);
	// x <- privkey
	wwFrom(x, privkey, mo);
	if (wwGetBits(x, params->r, B_OF_W(m) - params->r) != 0)
	{
		blobClose(state);
		return ERR_BAD_PRIVKEY;
	}
	// y <- pubkey
	wwFrom(y, pubkey, no);
	if (wwIsZero(y, n) || wwCmp(y, qr->mod, n) >= 0)
	{
		blobClose(state);
		return ERR_BAD_PUBKEY;
	}
	qrPower(y, y, x, m, qr, stack);
	// выгрузить открытый ключ
	qrTo((octet*)y, y, qr, stack);
	memCopy(sharekey, y, O_OF_B(params->n));
	if (params->n % 8)
		sharekey[params->n / 8] &= (octet)255 >> (8 - params->n % 8);
	// все нормально
	blobClose(state);
	return ERR_OK;
}